

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O2

void __thiscall HighsPrimalHeuristics::setupIntCols(HighsPrimalHeuristics *this)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  int bad_allowed;
  
  std::vector<int,_std::allocator<int>_>::operator=
            (&this->intcols,
             &((this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->integer_cols);
  begin._M_current =
       (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start;
  end._M_current =
       (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (begin._M_current != end._M_current) {
    bad_allowed = pdqsort_detail::log2<long>((long)end._M_current - (long)begin._M_current >> 2);
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0,false>
              (begin,end,(anon_class_8_1_8991fb9c)this,bad_allowed,true);
    return;
  }
  return;
}

Assistant:

void HighsPrimalHeuristics::setupIntCols() {
  intcols = mipsolver.mipdata_->integer_cols;

  pdqsort(intcols.begin(), intcols.end(), [&](HighsInt c1, HighsInt c2) {
    const FP_32BIT_VOLATILE double lockScore1 =
        (mipsolver.mipdata_->feastol + mipsolver.mipdata_->uplocks[c1]) *
        (mipsolver.mipdata_->feastol + mipsolver.mipdata_->downlocks[c1]);

    const FP_32BIT_VOLATILE double lockScore2 =
        (mipsolver.mipdata_->feastol + mipsolver.mipdata_->uplocks[c2]) *
        (mipsolver.mipdata_->feastol + mipsolver.mipdata_->downlocks[c2]);

    if (lockScore1 > lockScore2) return true;
    if (lockScore2 > lockScore1) return false;

    const FP_32BIT_VOLATILE double cliqueScore1 =
        (mipsolver.mipdata_->feastol +
         mipsolver.mipdata_->cliquetable.getNumImplications(c1, 1)) *
        (mipsolver.mipdata_->feastol +
         mipsolver.mipdata_->cliquetable.getNumImplications(c1, 0));

    const FP_32BIT_VOLATILE double cliqueScore2 =
        (mipsolver.mipdata_->feastol +
         mipsolver.mipdata_->cliquetable.getNumImplications(c2, 1)) *
        (mipsolver.mipdata_->feastol +
         mipsolver.mipdata_->cliquetable.getNumImplications(c2, 0));

    return std::make_tuple(cliqueScore1, HighsHashHelpers::hash(uint64_t(c1)),
                           c1) >
           std::make_tuple(cliqueScore2, HighsHashHelpers::hash(uint64_t(c2)),
                           c2);
  });
}